

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool-options.h
# Opt level: O2

ToolOptions * __thiscall
wasm::ToolOptions::addFeature(ToolOptions *this,Feature feature,string *description)

{
  string *psVar1;
  Feature f;
  Feature f_00;
  _Any_data local_230;
  code *local_220;
  code *local_218;
  _Any_data local_210;
  code *local_200;
  code *local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0;
  string local_190 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"--enable-",&local_30);
  FeatureSet::toString_abi_cxx11_(&local_1b0,(FeatureSet *)(ulong)feature,f);
  std::operator+(&local_1f0,&local_1d0,&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>(local_190,"",&local_2f);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"Enable ",&local_2e);
  std::operator+(&local_170,&local_150,description);
  std::__cxx11::string::string<std::allocator<char>>(local_130,"Tool options",&local_2d);
  local_230._12_4_ = 0;
  local_230._8_4_ = feature;
  local_218 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:182:12)>
              ::_M_invoke;
  local_220 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:182:12)>
              ::_M_manager;
  local_230._M_unused._M_object = this;
  psVar1 = (string *)
           ::wasm::Options::add
                     ((string *)this,(string *)&local_1f0,local_190,(string *)&local_170,
                      (Arguments)local_130,(function *)0x0,SUB81(&local_230,0));
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"--disable-",&local_2c);
  FeatureSet::toString_abi_cxx11_(&local_d0,(FeatureSet *)(ulong)feature,f_00);
  std::operator+(&local_110,&local_f0,&local_d0);
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"",&local_2b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Disable ",&local_2a);
  std::operator+(&local_90,&local_70,description);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"Tool options",&local_29);
  local_210._12_4_ = 0;
  local_210._8_4_ = feature;
  local_1f8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:192:12)>
              ::_M_invoke;
  local_200 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:192:12)>
              ::_M_manager;
  local_210._M_unused._M_object = this;
  ::wasm::Options::add
            (psVar1,(string *)&local_110,local_b0,(string *)&local_90,(Arguments)local_50,
             (function *)0x0,SUB81(&local_210,0));
  std::_Function_base::~_Function_base((_Function_base *)&local_210);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::_Function_base::~_Function_base((_Function_base *)&local_230);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  return this;
}

Assistant:

ToolOptions& addFeature(FeatureSet::Feature feature,
                          const std::string& description) {
    (*this)
      .add(std::string("--enable-") + FeatureSet::toString(feature),
           "",
           std::string("Enable ") + description,
           ToolOptionsCategory,
           Arguments::Zero,
           [this, feature](Options*, const std::string&) {
             enabledFeatures.set(feature, true);
             disabledFeatures.set(feature, false);
           })

      .add(std::string("--disable-") + FeatureSet::toString(feature),
           "",
           std::string("Disable ") + description,
           ToolOptionsCategory,
           Arguments::Zero,
           [this, feature](Options*, const std::string&) {
             enabledFeatures.set(feature, false);
             disabledFeatures.set(feature, true);
           });
    return *this;
  }